

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  uint argc_00;
  int iVar3;
  uint uVar4;
  char **argv_00;
  cmCTestScriptHandler *this;
  ostream *poVar5;
  bool collapse;
  ulong uVar6;
  ulong uVar7;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  CommandLineArguments encoding_args;
  char *local_728 [4];
  ostringstream cmCTestLog_msg;
  _Alloc_hider local_700;
  cmCTest inst;
  
  cmsys::Encoding::CommandLineArguments::Main(&encoding_args,argc,argv);
  argc_00 = cmsys::Encoding::CommandLineArguments::argc(&encoding_args);
  argv_00 = cmsys::Encoding::CommandLineArguments::argv(&encoding_args);
  cmSystemTools::DoNotInheritStdPipes();
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(*argv_00);
  if ((1 < (int)argc_00) && (iVar3 = strcmp(argv_00[1],"--launch"), iVar3 == 0)) {
    uVar4 = cmCTestLaunch::Main(argc_00,argv_00);
    goto LAB_002d8156;
  }
  cmCTest::cmCTest(&inst);
  uVar4 = 1;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&cmCTestLog_msg,(SystemTools *)0x1,collapse);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (local_700._M_p == (pointer)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Current working directory cannot be established.");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::stringbuf::str();
    cmCTest::Log(&inst,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                 ,0x9b,output._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  else {
    if ((int)argc_00 < 2) {
      bVar1 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
      if ((!bVar1) && (bVar1 = cmsys::SystemTools::FileExists("DartTestfile.txt"), !bVar1)) {
        if (argc_00 == 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"*********************************");
          poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<(poVar5,"No test configuration file found!");
          poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<(poVar5,"*********************************");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::stringbuf::str();
          cmCTest::Log(&inst,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                       ,0xa9,output._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&output);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        }
        goto LAB_002d7ee3;
      }
    }
    else {
LAB_002d7ee3:
      cmDocumentation::cmDocumentation((cmDocumentation *)&cmCTestLog_msg);
      cmDocumentation::addCTestStandardDocSections((cmDocumentation *)&cmCTestLog_msg);
      uVar4 = 0;
      bVar1 = cmDocumentation::CheckOptions
                        ((cmDocumentation *)&cmCTestLog_msg,argc_00,argv_00,(char *)0x0);
      if (bVar1) {
        this = (cmCTestScriptHandler *)cmCTest::GetHandler(&inst,"script");
        cmCTestScriptHandler::CreateCMake(this);
        cmCTestLog_msg = (ostringstream)0x0;
        std::__cxx11::string::string((string *)&output,"ctest",(allocator *)local_728);
        cmDocumentation::SetName((cmDocumentation *)&cmCTestLog_msg,&output);
        std::__cxx11::string::~string((string *)&output);
        cmDocumentation::SetSection((cmDocumentation *)&cmCTestLog_msg,"Name",cmDocumentationName);
        cmDocumentation::SetSection((cmDocumentation *)&cmCTestLog_msg,"Usage",cmDocumentationUsage)
        ;
        cmDocumentation::PrependSection
                  ((cmDocumentation *)&cmCTestLog_msg,"Options",cmDocumentationOptions);
        bVar2 = cmDocumentation::PrintRequestedDocumentation
                          ((cmDocumentation *)&cmCTestLog_msg,(ostream *)&std::cout);
        uVar4 = (uint)!bVar2;
      }
      cmDocumentation::~cmDocumentation((cmDocumentation *)&cmCTestLog_msg);
      if (bVar1) goto LAB_002d8149;
    }
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar7 = 0;
    uVar6 = (ulong)argc_00;
    if ((int)argc_00 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      std::__cxx11::string::string((string *)&cmCTestLog_msg,argv_00[uVar7],(allocator *)&output);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    uVar4 = cmCTest::Run(&inst,&args,&output);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,(string *)&output);
    std::__cxx11::stringbuf::str();
    cmCTest::Log(&inst,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                 ,0xc4,local_728[0],false);
    std::__cxx11::string::~string((string *)local_728);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
  }
LAB_002d8149:
  cmCTest::~cmCTest(&inst);
LAB_002d8156:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&encoding_args);
  return uVar4;
}

Assistant:

int main(int argc, char const* const* argv)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::DoNotInheritStdPipes();
  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(argv[0]);

  // Dispatch 'ctest --launch' mode directly.
  if (argc >= 2 && strcmp(argv[1], "--launch") == 0) {
    return cmCTestLaunch::Main(argc, argv);
  }

  cmCTest inst;

  if (cmSystemTools::GetCurrentWorkingDirectory().empty()) {
    cmCTestLog(&inst, ERROR_MESSAGE,
               "Current working directory cannot be established."
                 << std::endl);
    return 1;
  }

  // If there is a testing input file, check for documentation options
  // only if there are actually arguments.  We want running without
  // arguments to run tests.
  if (argc > 1 ||
      !(cmSystemTools::FileExists("CTestTestfile.cmake") ||
        cmSystemTools::FileExists("DartTestfile.txt"))) {
    if (argc == 1) {
      cmCTestLog(&inst, ERROR_MESSAGE, "*********************************"
                   << std::endl
                   << "No test configuration file found!" << std::endl
                   << "*********************************" << std::endl);
    }
    cmDocumentation doc;
    doc.addCTestStandardDocSections();
    if (doc.CheckOptions(argc, argv)) {
      // Construct and print requested documentation.
      cmCTestScriptHandler* ch =
        static_cast<cmCTestScriptHandler*>(inst.GetHandler("script"));
      ch->CreateCMake();

      doc.SetShowGenerators(false);
      doc.SetName("ctest");
      doc.SetSection("Name", cmDocumentationName);
      doc.SetSection("Usage", cmDocumentationUsage);
      doc.PrependSection("Options", cmDocumentationOptions);
      return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
    }
  }

  // copy the args to a vector
  std::vector<std::string> args;
  for (int i = 0; i < argc; ++i) {
    args.push_back(argv[i]);
  }
  // run ctest
  std::string output;
  int res = inst.Run(args, &output);
  cmCTestLog(&inst, OUTPUT, output);

  return res;
}